

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O2

bool EV_DoPillar(EPillar type,line_t_conflict *line,int tag,double speed,double height,
                double height2,int crush,bool hexencrush)

{
  bool bVar1;
  uint uVar2;
  DPillar *this;
  sector_t_conflict *sector;
  bool bVar3;
  double dVar4;
  double dVar5;
  FSectorTagIterator itr;
  
  FSectorTagIterator::FSectorTagIterator(&itr,tag,line);
  bVar3 = false;
  while( true ) {
    uVar2 = FSectorTagIterator::Next(&itr);
    if ((int)uVar2 < 0) break;
    sector = sectors + uVar2;
    bVar1 = sector_t::PlaneMoving((sector_t *)sector,0);
    if (!bVar1) {
      bVar1 = sector_t::PlaneMoving((sector_t *)sector,1);
      if (!bVar1) {
        dVar4 = sector_t::CenterFloor((sector_t *)sector);
        dVar5 = sector_t::CenterCeiling((sector_t *)sector);
        if (type != pillarBuild || dVar4 != dVar5) {
          if (type != pillarOpen || dVar4 == dVar5) {
            this = (DPillar *)DObject::operator_new(0x88);
            bVar3 = true;
            DPillar::DPillar(this,sector,type,speed,height,height2,crush,hexencrush);
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool EV_DoPillar (DPillar::EPillar type, line_t *line, int tag,
				  double speed, double height, double height2, int crush, bool hexencrush)
{
	int secnum;
	sector_t *sec;
	bool rtn = false;

	// check if a manual trigger; if so do just the sector on the backside
	FSectorTagIterator itr(tag, line);
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];

		if (sec->PlaneMoving(sector_t::floor) || sec->PlaneMoving(sector_t::ceiling))
			continue;

		double flor, ceil;

		flor = sec->CenterFloor ();
		ceil = sec->CenterCeiling ();

		if (type == DPillar::pillarBuild && flor == ceil)
			continue;

		if (type == DPillar::pillarOpen && flor != ceil)
			continue;

		rtn = true;
		new DPillar (sec, type, speed, height, height2, crush, hexencrush);
	}
	return rtn;
}